

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O1

size_t __thiscall rtosc::Port::MetaContainer::length(MetaContainer *this)

{
  char *pcVar1;
  size_t sVar2;
  char cVar3;
  
  pcVar1 = this->str_ptr;
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
    sVar2 = 0;
  }
  else {
    cVar3 = '\0';
    for (sVar2 = 2; (cVar3 != '\0' || (pcVar1[sVar2 - 2] != '\0')); sVar2 = sVar2 + 1) {
      cVar3 = pcVar1[sVar2 - 2];
    }
  }
  return sVar2;
}

Assistant:

size_t Port::MetaContainer::length(void) const
{
        if(!str_ptr || !*str_ptr)
            return 0;
        char prev = 0;
        const char *itr = str_ptr;
        while(prev || *itr)
            prev = *itr++;
        return 2+(itr-str_ptr);
}